

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::computePrimalObjectiveValue(HEkk *this)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  HighsSimplexAnalysis *in_RDI;
  HighsInt iCol;
  HighsInt iVar;
  HighsInt iRow;
  value_type in_stack_ffffffffffffffd8;
  int local_14;
  int local_c;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             SUB84(in_stack_ffffffffffffffd8,0));
  *(undefined8 *)
   ((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8) = 0;
  for (local_c = 0;
      local_c < *(int *)((long)&in_RDI[1].thread_simplex_clocks.
                                super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      local_c = local_c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[1].cleanup_primal_change_distribution.num_count_,(long)local_c);
    iVar2 = *pvVar3;
    if (iVar2 < *(int *)&in_RDI[1].thread_simplex_clocks.
                         super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].cost_perturbation1_distribution.value_name_._M_string_length,
                          (long)local_c);
      in_stack_ffffffffffffffd8 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&in_RDI[1].thread_factor_clocks
                          ,(long)iVar2);
      *(double *)
       ((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8) =
           in_stack_ffffffffffffffd8 * *pvVar4 +
           *(double *)
            ((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8);
    }
  }
  for (local_14 = 0;
      local_14 <
      *(int *)&in_RDI[1].thread_simplex_clocks.
               super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_14 = local_14 + 1) {
    pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)
                        &in_RDI[1].cleanup_primal_change_distribution.max_value_,(long)local_14);
    if (*pvVar5 != '\0') {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].ftran_upper_hyper_density.num_one_,(long)local_14);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&in_RDI[1].thread_factor_clocks
                          ,(long)local_14);
      *(double *)
       ((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8) =
           dVar1 * *pvVar4 +
           *(double *)
            ((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8);
    }
  }
  *(double *)((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8) =
       in_RDI[1].AnIterTrace[4].AnIterTraceDensity[2] *
       *(double *)
        ((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8);
  *(double *)((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8) =
       *(double *)&in_RDI[1].leaving_variable +
       *(double *)
        ((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_.field_2 + 8);
  in_RDI[1].before_ftran_upper_hyper_density.field_0x4c = 1;
  HighsSimplexAnalysis::simplexTimerStop
            (in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             SUB84(in_stack_ffffffffffffffd8,0));
  return;
}

Assistant:

void HEkk::computePrimalObjectiveValue() {
  analysis_.simplexTimerStart(ComputePrObjClock);
  info_.primal_objective_value = 0;
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = basis_.basicIndex_[iRow];
    if (iVar < lp_.num_col_) {
      info_.primal_objective_value +=
          info_.baseValue_[iRow] * lp_.col_cost_[iVar];
    }
  }
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    if (basis_.nonbasicFlag_[iCol])
      info_.primal_objective_value +=
          info_.workValue_[iCol] * lp_.col_cost_[iCol];
  }
  info_.primal_objective_value *= cost_scale_;
  // Objective value calculation is done using primal values and
  // original costs so offset is vanilla
  info_.primal_objective_value += lp_.offset_;
  // Now have primal objective value
  status_.has_primal_objective_value = true;
  analysis_.simplexTimerStop(ComputePrObjClock);
}